

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

int Rtm_ManLatchMax(Rtm_Man_t *p)

{
  void *pvVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  lVar3 = (long)p->vObjs->nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    uVar2 = 0;
    do {
      pvVar1 = p->vObjs->pArray[lVar4];
      uVar5 = *(uint *)((long)pvVar1 + 8) >> 7 & 0xff;
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          uVar7 = *(uint *)((long)pvVar1 + uVar6 + 0x20) & 0xfff;
          if (uVar2 <= uVar7) {
            uVar2 = uVar7;
          }
          uVar6 = uVar6 + 0x10;
        } while (uVar5 << 4 != uVar6);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar3);
    return uVar2;
  }
  return 0;
}

Assistant:

int Rtm_ManLatchMax( Rtm_Man_t * p )
{
    Rtm_Obj_t * pObj;
    Rtm_Edg_t * pEdge;
    int nLatchMax = 0, i, k;//, c, Val;
    Rtm_ManForEachObj( p, pObj, i )
    Rtm_ObjForEachFaninEdge( pObj, pEdge, k )
    {
/*
        for ( c = 0; c < (int)pEdge->nLats; c++ )
        {
            Val = Rtm_ObjGetOne( p, pEdge, c );
            assert( Val == 1 || Val == 2 );
        }
*/
        nLatchMax = Abc_MaxInt( nLatchMax, (int)pEdge->nLats );
    }
    return nLatchMax;
}